

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeReader.cpp
# Opt level: O2

void __thiscall
Js::ByteCodeReader::Create
          (ByteCodeReader *this,FunctionBody *functionRead,uint startOffset,bool useOriginalByteCode
          )

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  ByteBlock *this_00;
  byte *pbVar5;
  
  if (functionRead == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeReader.cpp"
                                ,0x23,"(functionRead != nullptr)",
                                "Must provide valid function to execute");
    if (!bVar2) goto LAB_0078ddf0;
    *puVar4 = 0;
  }
  if (useOriginalByteCode) {
    this_00 = FunctionBody::GetOriginalByteCode(functionRead);
  }
  else {
    this_00 = FunctionBody::GetByteCode(functionRead);
  }
  if (this_00 == (ByteBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeReader.cpp"
                                ,0x29,"(byteCodeBlock != nullptr)",
                                "Must have valid byte-code to read");
    if (!bVar2) goto LAB_0078ddf0;
    *puVar4 = 0;
  }
  pbVar5 = ByteBlock::GetBuffer(this_00);
  this->m_startLocation = pbVar5;
  this->m_currentLocation = pbVar5 + startOffset;
  uVar3 = ByteBlock::GetLength(this_00);
  this->m_endLocation = pbVar5 + uVar3;
  if (pbVar5 + uVar3 < this->m_currentLocation) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeReader.cpp"
                                ,0x30,"(m_currentLocation <= m_endLocation)",
                                "m_currentLocation <= m_endLocation");
    if (!bVar2) {
LAB_0078ddf0:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  return;
}

Assistant:

void ByteCodeReader::Create(FunctionBody* functionRead, uint startOffset, bool useOriginalByteCode)
    {
        AssertMsg(functionRead != nullptr, "Must provide valid function to execute");

        ByteBlock * byteCodeBlock = useOriginalByteCode ?
            functionRead->GetOriginalByteCode() :
            functionRead->GetByteCode();

        AssertMsg(byteCodeBlock != nullptr, "Must have valid byte-code to read");

        m_startLocation = byteCodeBlock->GetBuffer();
        m_currentLocation = m_startLocation + startOffset;

#if DBG
        m_endLocation = m_startLocation + byteCodeBlock->GetLength();
        Assert(m_currentLocation <= m_endLocation);
#endif
    }